

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<capnp::Orphan<capnp::DynamicValue>_> * __thiscall
capnp::compiler::ValueTranslator::compileValue
          (Maybe<capnp::Orphan<capnp::DynamicValue>_> *__return_storage_ptr__,ValueTranslator *this,
          Reader src,Type type)

{
  ErrorReporter *pEVar1;
  Type type_00;
  undefined8 uVar2;
  undefined8 uVar3;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  bool bVar5;
  Which WVar6;
  int64_t iVar7;
  EnumSchema EVar8;
  StructSchema SVar9;
  char *pcVar10;
  anon_union_2_2_d12d5221_for_Type_3 aVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  char (*in_R8) [2];
  char *pcVar15;
  ReaderFor<DynamicEnum> RVar16;
  Fault f;
  Orphan<capnp::DynamicValue> local_138;
  Type local_f8;
  Reader local_e8;
  ReaderFor<DynamicList> local_98;
  RawBrandedSchema *local_50;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_48;
  Type local_40;
  
  local_f8.field_4 = type.field_4;
  local_f8.baseType = type.baseType;
  local_f8.listDepth = type.listDepth;
  local_f8.isImplicitParam = type.isImplicitParam;
  local_f8.field_3 = type.field_3;
  local_f8._6_2_ = type._6_2_;
  compileValueInner(&local_138,this,src,type);
  switch(local_138.type) {
  case UNKNOWN:
    goto switchD_0016f556_caseD_0;
  case VOID:
    if (local_f8.baseType != VOID) break;
LAB_0016f646:
    if (local_f8.listDepth != '\0') break;
    goto LAB_0016fbf5;
  case BOOL:
    if (local_f8.baseType == BOOL) goto LAB_0016f646;
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader(&local_e8,&local_138);
    iVar7 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_e8);
    DynamicValue::Reader::~Reader(&local_e8);
    iVar12 = 0;
    if (-1 < iVar7) goto LAB_0016f95c;
    WVar6 = LIST;
    if (local_f8.listDepth == '\0') {
      WVar6 = local_f8.baseType;
    }
    switch(WVar6) {
    case INT8:
      pcVar15 = (char *)0xffffffffffffff80;
      break;
    case INT16:
      pcVar15 = (char *)0xffffffffffff8000;
      break;
    case INT32:
      pcVar15 = (char *)0xffffffff80000000;
      break;
    case INT64:
    case FLOAT32:
    case FLOAT64:
      pcVar15 = (char *)0x8000000000000000;
      break;
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
      bVar5 = false;
      pcVar15 = (char *)0x0;
      goto LAB_0016f837;
    default:
      pcVar15 = (char *)0x1;
      bVar5 = true;
      goto LAB_0016f837;
    }
    bVar5 = false;
LAB_0016f837:
    iVar12 = 2;
    if (!bVar5) {
      if (iVar7 < (long)pcVar15) {
        uVar13 = 0;
        uVar14 = 0;
        if (0x3f < src._reader.dataSize) {
          uVar14 = (ulong)*(uint *)((long)src._reader.data + 4);
        }
        if (0x9f < src._reader.dataSize) {
          uVar13 = (ulong)*(uint *)((long)src._reader.data + 0x10);
        }
        in_R8 = (char (*) [2])0x1c;
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar14,uVar13,"Integer value out of range.");
        local_e8.type = 3;
        local_e8.field_1.listValue.reader.segment = (SegmentReader *)0x0;
        local_e8.field_1.listValue.reader.capTable = (CapTableReader *)0x0;
        local_e8.field_1.listValue.reader.ptr = (byte *)0x0;
        local_e8.field_1._40_8_ = (word *)0x0;
        local_138.field_1._8_8_ = local_e8.field_1._8_8_;
        local_138.type = INT;
        local_138._4_4_ = local_e8._4_4_;
        local_138.field_1.intValue = (int64_t)pcVar15;
        local_e8.field_1.intValue = (int64_t)pcVar15;
        if (local_138.builder.segment != (SegmentBuilder *)0x0) {
          _::OrphanBuilder::euthanize(&local_138.builder);
        }
        local_138.builder.capTable = (CapTableBuilder *)local_e8.field_1.listValue.reader.ptr;
        local_138.builder.location = (word *)local_e8.field_1._40_8_;
        local_138.builder.tag.content = local_e8.field_1._16_8_;
        local_138.builder.segment = (SegmentBuilder *)local_e8.field_1.listValue.reader.capTable;
      }
      (__return_storage_ptr__->ptr).isSet = true;
      *(ulong *)&(__return_storage_ptr__->ptr).field_1 = CONCAT44(local_138._4_4_,local_138.type);
      *(int64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_138.field_1.intValue;
      *(anon_union_8_2_eba6ea51_for_Type_5 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           local_138.field_1.listSchema.elementType.field_4;
      (__return_storage_ptr__->ptr).field_1.value.builder.segment = local_138.builder.segment;
      (__return_storage_ptr__->ptr).field_1.value.builder.capTable = local_138.builder.capTable;
      (__return_storage_ptr__->ptr).field_1.value.builder.location = local_138.builder.location;
      (__return_storage_ptr__->ptr).field_1.value.builder.tag.content =
           local_138.builder.tag.content;
      local_138.builder.segment = (SegmentBuilder *)0x0;
      local_138.builder.location = (word *)0x0;
      iVar12 = 1;
    }
LAB_0016f95c:
    if (iVar12 == 2) break;
    if (iVar12 != 0) goto LAB_0016fc3a;
switchD_0016f556_caseD_4:
    WVar6 = LIST;
    if (local_f8.listDepth == '\0') {
      WVar6 = local_f8.baseType;
    }
    switch(WVar6) {
    case INT8:
      pcVar15 = (char *)0x7f;
      break;
    case INT16:
      pcVar15 = (char *)0x7fff;
      break;
    case INT32:
      pcVar15 = (char *)0x7fffffff;
      break;
    case INT64:
      pcVar15 = (char *)0x7fffffffffffffff;
      break;
    case UINT8:
      pcVar15 = (char *)0xff;
      break;
    case UINT16:
      pcVar15 = (char *)0xffff;
      break;
    case UINT32:
      pcVar15 = (char *)0xffffffff;
      break;
    case UINT64:
    case FLOAT32:
    case FLOAT64:
      pcVar15 = (char *)0xffffffffffffffff;
      break;
    default:
      bVar5 = true;
      pcVar15 = (char *)0x0;
      goto LAB_0016f9e4;
    }
    bVar5 = false;
LAB_0016f9e4:
    if (!bVar5) {
      Orphan<capnp::DynamicValue>::getReader(&local_e8,&local_138);
      pcVar10 = (char *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                  (&local_e8);
      DynamicValue::Reader::~Reader(&local_e8);
      if (pcVar15 < pcVar10) {
        uVar13 = 0;
        uVar14 = 0;
        if (0x3f < src._reader.dataSize) {
          uVar14 = (ulong)*(uint *)((long)src._reader.data + 4);
        }
        if (0x9f < src._reader.dataSize) {
          uVar13 = (ulong)*(uint *)((long)src._reader.data + 0x10);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar14,uVar13,"Integer value out of range.",0x1c);
        local_e8.type = 4;
        local_e8.field_1.listValue.reader.segment = (SegmentReader *)0x0;
        local_e8.field_1.listValue.reader.capTable = (CapTableReader *)0x0;
        local_e8.field_1.listValue.reader.ptr = (byte *)0x0;
        local_e8.field_1._40_8_ = (word *)0x0;
        local_138.field_1._8_8_ = local_e8.field_1._8_8_;
        local_138.type = UINT;
        local_138._4_4_ = local_e8._4_4_;
        local_138.field_1.uintValue = (uint64_t)pcVar15;
        local_e8.field_1.uintValue = (uint64_t)pcVar15;
        if (local_138.builder.segment != (SegmentBuilder *)0x0) {
          _::OrphanBuilder::euthanize(&local_138.builder);
        }
        local_138.builder.capTable = (CapTableBuilder *)local_e8.field_1.listValue.reader.ptr;
        local_138.builder.location = (word *)local_e8.field_1._40_8_;
        local_138.builder.tag.content = local_e8.field_1._16_8_;
        local_138.builder.segment = (SegmentBuilder *)local_e8.field_1.listValue.reader.capTable;
      }
LAB_0016fbf5:
      (__return_storage_ptr__->ptr).isSet = true;
LAB_0016fbfd:
      (__return_storage_ptr__->ptr).field_1.value.type = local_138.type;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 4) = local_138._4_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           local_138.field_1.intValue._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) =
           local_138.field_1.intValue._4_4_;
      *(anon_union_8_2_eba6ea51_for_Type_5 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           local_138.field_1.listSchema.elementType.field_4;
      (__return_storage_ptr__->ptr).field_1.value.builder.segment = local_138.builder.segment;
      (__return_storage_ptr__->ptr).field_1.value.builder.capTable = local_138.builder.capTable;
      (__return_storage_ptr__->ptr).field_1.value.builder.location = local_138.builder.location;
      (__return_storage_ptr__->ptr).field_1.value.builder.tag.content =
           local_138.builder.tag.content;
      local_138.builder.segment = (SegmentBuilder *)0x0;
      local_138.builder.location = (word *)0x0;
      goto LAB_0016fc3a;
    }
    break;
  case UINT:
    goto switchD_0016f556_caseD_4;
  case FLOAT:
    if ((local_f8.baseType & ~BOOL) != FLOAT32) break;
LAB_0016f682:
    if (local_f8.listDepth != '\0') break;
LAB_0016f68d:
    (__return_storage_ptr__->ptr).isSet = true;
    goto LAB_0016fbfd;
  case TEXT:
    if (local_f8.baseType == TEXT) goto LAB_0016f682;
    break;
  case DATA:
    if (local_f8.baseType == DATA) goto LAB_0016f682;
    break;
  case LIST:
    if (local_f8.listDepth == '\0') {
      if (local_f8.baseType == ANY_POINTER) {
        aVar11.paramIndex = 0;
        if (local_f8.field_4.schema == (RawBrandedSchema *)0x0) {
          aVar11 = local_f8.field_3;
        }
        if (local_f8.isImplicitParam != false) {
          aVar11.paramIndex = 0;
        }
        if ((aVar11.paramIndex & 0xfffd) == 0) goto LAB_0016f68d;
      }
    }
    else {
      Orphan<capnp::DynamicValue>::getReader(&local_e8,&local_138);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_98,&local_e8);
      local_50 = (RawBrandedSchema *)local_98.schema.elementType._0_8_;
      aStack_48 = local_98.schema.elementType.field_4;
      local_40 = (Type)Type::asList(&local_f8);
      bVar5 = Type::operator==((Type *)&local_50,&local_40);
      DynamicValue::Reader::~Reader(&local_e8);
      if (bVar5) goto LAB_0016f68d;
    }
    break;
  case ENUM:
    if ((local_f8.baseType == ENUM) && (local_f8.listDepth == '\0')) {
      Orphan<capnp::DynamicValue>::getReader(&local_e8,&local_138);
      RVar16 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(&local_e8);
      EVar8 = Type::asEnum(&local_f8);
      DynamicValue::Reader::~Reader(&local_e8);
      if ((RawBrandedSchema *)RVar16.schema.super_Schema.raw == EVar8.super_Schema.raw)
      goto LAB_0016f68d;
    }
    break;
  case STRUCT:
    if (local_f8.listDepth == '\0' && local_f8.baseType == STRUCT) {
      Orphan<capnp::DynamicValue>::getReader(&local_e8,&local_138);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&local_98,&local_e8);
      uVar2 = local_98.schema.elementType._0_8_;
      SVar9 = Type::asStruct(&local_f8);
      DynamicValue::Reader::~Reader(&local_e8);
      if ((Schema)uVar2 == SVar9.super_Schema.raw) goto LAB_0016f68d;
    }
    else if ((local_f8.baseType == ANY_POINTER && local_f8.listDepth == '\0') &&
            (((local_f8.isImplicitParam != false ||
              (local_f8.field_4.schema != (RawBrandedSchema *)0x0)) ||
             (local_f8.field_3.paramIndex < 2)))) goto LAB_0016f68d;
    break;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb14,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb17,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  }
  pEVar1 = this->errorReporter;
  type_00.listDepth = local_f8.listDepth;
  type_00.baseType = local_f8.baseType;
  type_00.isImplicitParam = local_f8.isImplicitParam;
  type_00.field_3.paramIndex = local_f8.field_3.paramIndex;
  type_00._6_2_ = local_f8._6_2_;
  type_00.field_4.schema = local_f8.field_4.schema;
  makeTypeName((String *)&local_98,this,type_00);
  kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
            ((String *)&local_e8,(kj *)"Type mismatch; expected ",(char (*) [25])&local_98,
             (String *)0x1d32fd,in_R8);
  pcVar15 = (char *)local_e8._0_8_;
  if (local_e8.field_1._0_8_ == (char *)0x0) {
    pcVar15 = "";
  }
  uVar13 = 0;
  uVar14 = 0;
  if (0x3f < src._reader.dataSize) {
    uVar14 = (ulong)*(uint *)((long)src._reader.data + 4);
  }
  if (0x9f < src._reader.dataSize) {
    uVar13 = (ulong)*(uint *)((long)src._reader.data + 0x10);
  }
  (**pEVar1->_vptr_ErrorReporter)
            (pEVar1,uVar14,uVar13,pcVar15,
             local_e8.field_1.textValue.super_StringPtr.content.ptr +
             (local_e8.field_1._0_8_ == (char *)0x0));
  uVar3 = local_e8.field_1.textValue.super_StringPtr.content.ptr;
  uVar2 = local_e8._0_8_;
  if ((char *)local_e8._0_8_ != (char *)0x0) {
    local_e8._0_8_ = (char *)0x0;
    local_e8.field_1.intValue = 0;
    (*(code *)((RawSchema *)(local_e8.field_1.structValue.reader.segment)->arena)->id)
              (local_e8.field_1.textValue.super_StringPtr.content.size_,uVar2,1,uVar3,uVar3,0);
  }
  aVar4 = local_98.schema.elementType.field_4;
  uVar2 = local_98.schema.elementType._0_8_;
  if ((RawBrandedSchema *)local_98.schema.elementType._0_8_ != (RawBrandedSchema *)0x0) {
    local_98.schema.elementType._0_8_ = (RawBrandedSchema *)0x0;
    local_98.schema.elementType.field_4.schema = (RawBrandedSchema *)0x0;
    (*(code *)(local_98.reader.segment)->arena->_vptr_Arena)
              (local_98.reader.segment,uVar2,1,aVar4.schema,aVar4.schema,0);
  }
switchD_0016f556_caseD_0:
  (__return_storage_ptr__->ptr).isSet = false;
LAB_0016fc3a:
  if (local_138.builder.segment != (SegmentBuilder *)0x0) {
    _::OrphanBuilder::euthanize(&local_138.builder);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<DynamicValue>> ValueTranslator::compileValue(Expression::Reader src, Type type) {
  Orphan<DynamicValue> result = compileValueInner(src, type);

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      // Error already reported.
      return nullptr;

    case DynamicValue::VOID:
      if (type.isVoid()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::BOOL:
      if (type.isBool()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue = 1;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: break;
        }
        if (minValue == 1) break;

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return kj::mv(result);
      }

    } // fallthrough -- value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue = 0;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: break;
      }
      if (maxValue == 0) break;

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return kj::mv(result);
    }

    case DynamicValue::FLOAT:
      if (type.isFloat32() || type.isFloat64()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::TEXT:
      if (type.isText()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::DATA:
      if (type.isData()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::LIST:
      if (type.isList()) {
        if (result.getReader().as<DynamicList>().getSchema() == type.asList()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::ENUM:
      if (type.isEnum()) {
        if (result.getReader().as<DynamicEnum>().getSchema() == type.asEnum()) {
          return kj::mv(result);
        }
      }
      break;

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        if (result.getReader().as<DynamicStruct>().getSchema() == type.asStruct()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
  return nullptr;
}